

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string_view virtual_file,string *disk_file)

{
  string_view filename;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int *piVar2;
  AlphaNum *b;
  char *extraout_RDX;
  string_view sVar3;
  string_view path;
  bool local_1b9;
  AlphaNum local_1b8;
  AlphaNum local_188;
  string local_158;
  int local_134;
  string_view local_130;
  ZeroCopyInputStream *local_120;
  ZeroCopyInputStream *stream;
  char *local_110;
  string_view local_108;
  DiskSourceTree *local_f8;
  char *pcStack_f0;
  undefined1 local_e8 [8];
  string temp_disk_file;
  Mapping *mapping;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  *__range2;
  string local_70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  DiskSourceTree *local_40;
  char *local_38;
  string *local_30;
  string *disk_file_local;
  DiskSourceTree *this_local;
  string_view virtual_file_local;
  
  sVar3._M_len = virtual_file._M_str;
  local_40 = (DiskSourceTree *)virtual_file._M_len;
  sVar3._M_str = (char *)disk_file;
  local_38 = sVar3._M_len;
  local_30 = disk_file;
  disk_file_local = (string *)this;
  this_local = local_40;
  virtual_file_local._M_len = (size_t)sVar3._M_len;
  CanonicalizePath_abi_cxx11_(&local_70,(compiler *)local_40,sVar3);
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  __x._M_str = local_38;
  __x._M_len = (size_t)local_40;
  bVar1 = std::operator!=(__x,local_50);
  local_1b9 = true;
  if (!bVar1) {
    path._M_str = extraout_RDX;
    path._M_len = virtual_file_local._M_len;
    local_1b9 = ContainsParentReference((compiler *)this_local,path);
  }
  std::__cxx11::string::~string((string *)&local_70);
  if (local_1b9 == false) {
    __end2 = std::
             vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ::begin(&this->mappings_);
    mapping = (Mapping *)
              std::
              vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
              ::end(&this->mappings_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
                                  *)&mapping);
      if (!bVar1) break;
      temp_disk_file.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_e8);
      local_f8 = this_local;
      pcStack_f0 = (char *)virtual_file_local._M_len;
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)temp_disk_file.field_2._8_8_);
      local_108 = sVar3;
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(temp_disk_file.field_2._8_8_ + 0x20));
      local_110 = sVar3._M_str;
      stream = (ZeroCopyInputStream *)sVar3._M_len;
      filename._M_str = pcStack_f0;
      filename._M_len = (size_t)local_f8;
      b = (AlphaNum *)local_108._M_str;
      bVar1 = ApplyMapping(filename,local_108,sVar3,(string *)local_e8);
      if (bVar1) {
        sVar3 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e8);
        local_130 = sVar3;
        local_120 = OpenDiskFile(this,sVar3);
        if (local_120 == (ZeroCopyInputStream *)0x0) {
          piVar2 = __errno_location();
          if (*piVar2 != 0xd) goto LAB_002b1cbb;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_188,"Read access is denied for file: ");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
          absl::lts_20250127::StrCat_abi_cxx11_(&local_158,(lts_20250127 *)&local_188,&local_1b8,b);
          std::__cxx11::string::operator=((string *)&this->last_error_message_,(string *)&local_158)
          ;
          std::__cxx11::string::~string((string *)&local_158);
          virtual_file_local._M_str = (char *)0x0;
          local_134 = 1;
        }
        else {
          if (local_30 != (string *)0x0) {
            std::__cxx11::string::operator=((string *)local_30,(string *)local_e8);
          }
          virtual_file_local._M_str = (char *)local_120;
          local_134 = 1;
        }
      }
      else {
LAB_002b1cbb:
        local_134 = 0;
      }
      std::__cxx11::string::~string((string *)local_e8);
      if (local_134 != 0) {
        return (ZeroCopyInputStream *)virtual_file_local._M_str;
      }
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator=((string *)&this->last_error_message_,"File not found.");
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->last_error_message_,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
              );
  }
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    absl::string_view virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return nullptr;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != nullptr) {
        if (disk_file != nullptr) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            absl::StrCat("Read access is denied for file: ", temp_disk_file);
        return nullptr;
      }
    }
  }
  last_error_message_ = "File not found.";
  return nullptr;
}